

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

ShaderVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::ShaderVkImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::ShaderVkImpl,Diligent::FixedBlockMemoryAllocator> *this,
          RenderDeviceVkImpl **CtorArgs,ShaderCreateInfo *CtorArgs_1,CreateInfo *CtorArgs_2)

{
  RenderDeviceVkImpl **ppRVar1;
  ShaderVkImpl *local_40;
  ShaderVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  CreateInfo *CtorArgs_local_2;
  ShaderCreateInfo *CtorArgs_local_1;
  RenderDeviceVkImpl **CtorArgs_local;
  MakeNewRCObj<Diligent::ShaderVkImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  ppRVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (ShaderVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (ShaderVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_40 = (ShaderVkImpl *)
               RefCountedObject<Diligent::IShaderVk>::operator_new
                         ((RefCountedObject<Diligent::IShaderVk> *)0xb8,(size_t)ppRVar1);
    ShaderVkImpl::ShaderVkImpl
              (local_40,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1,CtorArgs_2,false);
  }
  else {
    local_40 = (ShaderVkImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0xb8,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    ShaderVkImpl::ShaderVkImpl
              (local_40,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1,CtorArgs_2,false);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::ShaderVkImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_40,*(FixedBlockMemoryAllocator **)this);
  }
  return local_40;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }